

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeIntegerAffinity(Mem *pMem)

{
  double dVar1;
  double *in_RDI;
  i64 ix;
  
  dVar1 = (double)doubleToInt64(*in_RDI);
  if ((((*in_RDI == (double)(long)dVar1) && (!NAN(*in_RDI) && !NAN((double)(long)dVar1))) &&
      (-0x8000000000000000 < (long)dVar1)) && ((long)dVar1 < 0x7fffffffffffffff)) {
    *in_RDI = dVar1;
    *(ushort *)(in_RDI + 1) = *(ushort *)(in_RDI + 1) & 0x3e00 | 4;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeIntegerAffinity(Mem *pMem){
  i64 ix;
  assert( pMem->flags & MEM_Real );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );

  ix = doubleToInt64(pMem->u.r);

  /* Only mark the value as an integer if
  **
  **    (1) the round-trip conversion real->int->real is a no-op, and
  **    (2) The integer is neither the largest nor the smallest
  **        possible integer (ticket #3922)
  **
  ** The second and third terms in the following conditional enforces
  ** the second condition under the assumption that addition overflow causes
  ** values to wrap around.
  */
  if( pMem->u.r==ix && ix>SMALLEST_INT64 && ix<LARGEST_INT64 ){
    pMem->u.i = ix;
    MemSetTypeFlag(pMem, MEM_Int);
  }
}